

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

void google::anon_unknown_0::DumpStackFrameInfo(char *prefix,void *pc)

{
  char *__first;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  char local_858 [8];
  char symbolized [1024];
  char buf [1024];
  undefined1 local_50 [8];
  MinimalFormatter formatter;
  
  bVar1 = Symbolize((void *)((long)pc + -1),local_858,0x400);
  local_50 = (undefined1  [8])(symbolized + 0x3f8);
  formatter.cursor_ = buf + 0x3f8;
  formatter.buffer_ = (char *)local_50;
  MinimalFormatter::AppendString((MinimalFormatter *)local_50,prefix);
  MinimalFormatter::AppendString((MinimalFormatter *)local_50,"@ ");
  __first = formatter.buffer_;
  MinimalFormatter::AppendString((MinimalFormatter *)local_50,"0x");
  MinimalFormatter::AppendUint64((MinimalFormatter *)local_50,(uint64)pc,0x10);
  pcVar3 = __first + 0x12;
  if (formatter.buffer_ < pcVar3) {
    lVar2 = (long)pcVar3 - (long)formatter.buffer_;
    std::copy<char*,char*>(__first,formatter.buffer_,__first + lVar2);
    formatter.end_._7_1_ = 0x20;
    std::fill<char*,char>(__first,__first + lVar2,(char *)((long)&formatter.end_ + 7));
    formatter.buffer_ = pcVar3;
  }
  pcVar3 = "(unknown)";
  if (bVar1) {
    pcVar3 = local_858;
  }
  MinimalFormatter::AppendString((MinimalFormatter *)local_50," ");
  MinimalFormatter::AppendString((MinimalFormatter *)local_50,pcVar3);
  MinimalFormatter::AppendString((MinimalFormatter *)local_50,"\n");
  (*(code *)(anonymous_namespace)::g_failure_writer)
            (symbolized + 0x3f8,(long)formatter.buffer_ - (long)local_50);
  return;
}

Assistant:

void DumpStackFrameInfo(const char* prefix, void* pc) {
  // Get the symbol name.
  const char *symbol = "(unknown)";
  char symbolized[1024];  // Big enough for a sane symbol.
  // Symbolizes the previous address of pc because pc may be in the
  // next function.
  if (Symbolize(reinterpret_cast<char *>(pc) - 1,
                symbolized, sizeof(symbolized))) {
    symbol = symbolized;
  }

  char buf[1024];  // Big enough for stack frame info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString(prefix);
  formatter.AppendString("@ ");
  const int width = 2 * sizeof(void*) + 2;  // + 2  for "0x".
  formatter.AppendHexWithPadding(reinterpret_cast<uintptr_t>(pc), width);
  formatter.AppendString(" ");
  formatter.AppendString(symbol);
  formatter.AppendString("\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}